

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnReloc
          (BinaryReaderObjdump *this,RelocType type,Offset offset,Index index,uint32_t addend)

{
  char *pcVar1;
  int32_t signed_addend;
  ulong uVar2;
  string_view sVar3;
  string_view sVar4;
  
  uVar2 = (ulong)addend;
  if ((int)type < 0x17) {
    pcVar1 = *(char **)(g_reloc_type_name + (long)(int)type * 8);
  }
  else {
    pcVar1 = "<error_reloc_type>";
  }
  PrintDetails(this,"   - %-18s offset=%#08zx(file=%#08zx) ",pcVar1,offset,
               (this->super_BinaryReaderObjdumpBase).section_starts_
               [(this->super_BinaryReaderObjdumpBase).reloc_section_] + offset);
  if (type == TypeIndexLEB) {
    PrintDetails(this,"type=%u",(ulong)index);
  }
  else {
    sVar3 = BinaryReaderObjdumpBase::GetSymbolName(&this->super_BinaryReaderObjdumpBase,index);
    sVar4 = BinaryReaderObjdumpBase::GetSymbolName(&this->super_BinaryReaderObjdumpBase,index);
    PrintDetails(this,"symbol=%u <%.*s>",(ulong)index,sVar3.size_ & 0xffffffff,sVar4.data_);
  }
  if (addend != 0) {
    if ((int)addend < 0) {
      PrintDetails(this,"-");
      uVar2 = (ulong)-addend;
    }
    else {
      PrintDetails(this,"+");
    }
    PrintDetails(this,"%#x",uVar2);
  }
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnReloc(RelocType type,
                                    Offset offset,
                                    Index index,
                                    uint32_t addend) {
  Offset total_offset = GetSectionStart(reloc_section_) + offset;
  PrintDetails("   - %-18s offset=%#08" PRIoffset "(file=%#08" PRIoffset ") ",
               GetRelocTypeName(type), offset, total_offset);
  if (type == RelocType::TypeIndexLEB) {
    PrintDetails("type=%" PRIindex, index);
  } else {
    PrintDetails("symbol=%" PRIindex " <" PRIstringview ">", index,
                 WABT_PRINTF_STRING_VIEW_ARG(GetSymbolName(index)));
  }

  if (addend) {
    int32_t signed_addend = static_cast<int32_t>(addend);
    if (signed_addend < 0) {
      PrintDetails("-");
      signed_addend = -signed_addend;
    } else {
      PrintDetails("+");
    }
    PrintDetails("%#x", signed_addend);
  }
  PrintDetails("\n");
  return Result::Ok;
}